

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

int __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::Rational>::copy
          (TypedAttribute<Imf_2_5::Rational> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  TypedAttribute<Imf_2_5::Rational> *this_00;
  
  this_00 = (TypedAttribute<Imf_2_5::Rational> *)operator_new(0x10);
  (this_00->super_Attribute)._vptr_Attribute = (_func_int **)0x0;
  (this_00->_value).n = 0;
  (this_00->_value).d = 0;
  TypedAttribute(this_00);
  (*(this_00->super_Attribute)._vptr_Attribute[6])(this_00,this);
  return (int)this_00;
}

Assistant:

Attribute *
TypedAttribute<T>::copy () const
{
    Attribute * attribute = new TypedAttribute<T>();
    attribute->copyValueFrom (*this);
    return attribute;
}